

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QString,QMetaMethod::MethodType>::emplace<QMetaMethod::MethodType_const&>
          (QHash<QString,QMetaMethod::MethodType> *this,QString *key,MethodType *args)

{
  Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QString,_QMetaMethod::MethodType> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> *)0x0) {
    local_28.d = (Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> *)0x0;
LAB_0013f0ef:
    pDVar1 = (Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> *)0x0;
LAB_0013f110:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_>::detached
                       (pDVar1);
    *(Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> **)this = pDVar1;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<QMetaMethod::MethodType_const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d._0_4_ = *args;
        pVar2 = (piter)QHash<QString,_QMetaMethod::MethodType>::
                       emplace_helper<QMetaMethod::MethodType>
                                 ((QHash<QString,_QMetaMethod::MethodType> *)this,key,
                                  (MethodType *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_0013f177;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar1 = *(Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> **)this;
      if (pDVar1 == (Data<QHashPrivate::Node<QString,_QMetaMethod::MethodType>_> *)0x0)
      goto LAB_0013f0ef;
    }
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0013f110;
  }
  pVar2 = (piter)emplace_helper<QMetaMethod::MethodType_const&>(this,key,args);
  QHash<QString,_QMetaMethod::MethodType>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_0013f177:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }